

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O0

void ResizeQueuePages(void)

{
  DdNode ***pppDVar1;
  DdNode ***newQueuePages;
  int i;
  
  queuePage = queuePage + 1;
  pppDVar1 = queuePages;
  if (queuePage == maxQueuePages) {
    pppDVar1 = (DdNode ***)malloc((long)(maxQueuePages + 0x80) << 3);
    if (pppDVar1 == (DdNode ***)0x0) {
      for (newQueuePages._4_4_ = 0; newQueuePages._4_4_ < queuePage;
          newQueuePages._4_4_ = newQueuePages._4_4_ + 1) {
        if (queuePages[newQueuePages._4_4_] != (DdNode **)0x0) {
          free(queuePages[newQueuePages._4_4_]);
          queuePages[newQueuePages._4_4_] = (DdNode **)0x0;
        }
      }
      if (queuePages != (DdNode ***)0x0) {
        free(queuePages);
        queuePages = (DdNode ***)0x0;
      }
      memOut = 1;
      return;
    }
    for (newQueuePages._4_4_ = 0; newQueuePages._4_4_ < maxQueuePages;
        newQueuePages._4_4_ = newQueuePages._4_4_ + 1) {
      pppDVar1[newQueuePages._4_4_] = queuePages[newQueuePages._4_4_];
    }
    maxQueuePages = maxQueuePages + 0x80;
    if (queuePages != (DdNode ***)0x0) {
      free(queuePages);
    }
  }
  queuePages = pppDVar1;
  currentQueuePage = (DdNode **)malloc((long)queuePageSize << 3);
  queuePages[queuePage] = currentQueuePage;
  if (currentQueuePage == (DdNode **)0x0) {
    for (newQueuePages._4_4_ = 0; newQueuePages._4_4_ < queuePage;
        newQueuePages._4_4_ = newQueuePages._4_4_ + 1) {
      if (queuePages[newQueuePages._4_4_] != (DdNode **)0x0) {
        free(queuePages[newQueuePages._4_4_]);
        queuePages[newQueuePages._4_4_] = (DdNode **)0x0;
      }
    }
    if (queuePages != (DdNode ***)0x0) {
      free(queuePages);
      queuePages = (DdNode ***)0x0;
    }
    memOut = 1;
  }
  else {
    queuePageIndex = 0;
  }
  return;
}

Assistant:

static void
ResizeQueuePages(void)
{
    int i;
    DdNode ***newQueuePages;

    queuePage++;
    /* If the current page index is larger than the number of pages
     * allocated, allocate a new page array. Page numbers are incremented by
     * INITIAL_PAGES
     */
    if (queuePage == maxQueuePages) {
        newQueuePages = ABC_ALLOC(DdNode **,maxQueuePages + INITIAL_PAGES);
        if (newQueuePages == NULL) {
            for (i = 0; i < queuePage; i++) ABC_FREE(queuePages[i]);
            ABC_FREE(queuePages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxQueuePages; i++) {
                newQueuePages[i] = queuePages[i];
            }
            /* Increase total page count */
            maxQueuePages += INITIAL_PAGES;
            ABC_FREE(queuePages);
            queuePages = newQueuePages;
        }
    }
    /* Allocate a new page */
    currentQueuePage = queuePages[queuePage] = ABC_ALLOC(DdNode *,queuePageSize);
    if (currentQueuePage == NULL) {
        for (i = 0; i < queuePage; i++) ABC_FREE(queuePages[i]);
        ABC_FREE(queuePages);
        memOut = 1;
        return;
    }
    /* reset page index */
    queuePageIndex = 0;
    return;

}